

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuperCardPro.cpp
# Opt level: O0

unique_ptr<SuperCardPro,_std::default_delete<SuperCardPro>_> SuperCardPro::Open(void)

{
  bool bVar1;
  __uniq_ptr_data<SuperCardPro,_std::default_delete<SuperCardPro>,_true,_true> in_RDI;
  unique_ptr<SuperCardPro,_std::default_delete<SuperCardPro>_> local_20;
  undefined1 local_11;
  unique_ptr<SuperCardPro,_std::default_delete<SuperCardPro>_> *p;
  
  local_11 = 0;
  std::unique_ptr<SuperCardPro,std::default_delete<SuperCardPro>>::
  unique_ptr<std::default_delete<SuperCardPro>,void>
            ((unique_ptr<SuperCardPro,std::default_delete<SuperCardPro>> *)
             in_RDI.super___uniq_ptr_impl<SuperCardPro,_std::default_delete<SuperCardPro>_>._M_t.
             super__Tuple_impl<0UL,_SuperCardPro_*,_std::default_delete<SuperCardPro>_>.
             super__Head_base<0UL,_SuperCardPro_*,_false>._M_head_impl);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr *)
                     in_RDI.super___uniq_ptr_impl<SuperCardPro,_std::default_delete<SuperCardPro>_>.
                     _M_t.super__Tuple_impl<0UL,_SuperCardPro_*,_std::default_delete<SuperCardPro>_>
                     .super__Head_base<0UL,_SuperCardPro_*,_false>._M_head_impl);
  if (!bVar1) {
    SuperCardProUSB::Open();
    std::unique_ptr<SuperCardPro,_std::default_delete<SuperCardPro>_>::operator=
              ((unique_ptr<SuperCardPro,_std::default_delete<SuperCardPro>_> *)
               in_RDI.super___uniq_ptr_impl<SuperCardPro,_std::default_delete<SuperCardPro>_>._M_t.
               super__Tuple_impl<0UL,_SuperCardPro_*,_std::default_delete<SuperCardPro>_>.
               super__Head_base<0UL,_SuperCardPro_*,_false>._M_head_impl,&local_20);
    std::unique_ptr<SuperCardPro,_std::default_delete<SuperCardPro>_>::~unique_ptr(&local_20);
  }
  return (__uniq_ptr_data<SuperCardPro,_std::default_delete<SuperCardPro>,_true,_true>)
         (tuple<SuperCardPro_*,_std::default_delete<SuperCardPro>_>)
         in_RDI.super___uniq_ptr_impl<SuperCardPro,_std::default_delete<SuperCardPro>_>._M_t.
         super__Tuple_impl<0UL,_SuperCardPro_*,_std::default_delete<SuperCardPro>_>.
         super__Head_base<0UL,_SuperCardPro_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<SuperCardPro> SuperCardPro::Open()
{
    std::unique_ptr<SuperCardPro> p;

#ifdef HAVE_FTD2XX
    if (!p)
        p = SuperCardProFTD2XX::Open();
#endif
#ifdef HAVE_FTDI
    if (!p)
        p = SuperCardProFTDI::Open();
#endif
    if (!p)
        p = SuperCardProUSB::Open();
#ifdef _WIN32
    if (!p)
        p = SuperCardProWin32::Open();
#endif

    return p;
}